

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_shq_que.c
# Opt level: O2

int shm_queue_pull_end(QcShmQue *shmQue,int idx,QcErr *err)

{
  int iVar1;
  
  qc_sem_wait(shmQue->sem_lst,-1);
  iVar1 = qc_staticlist_add_tail(&shmQue->p_shmQue->lst_free,idx);
  if (-1 < iVar1) {
    qc_sem_post(shmQue->sem_lst);
    return 0;
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_shq/qc_shq_que.c"
          ,0xe4);
  __assert_fail("index>=0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_shq/qc_shq_que.c"
                ,0xe4,"int shm_queue_pull_end(QcShmQue *, int, QcErr *)");
}

Assistant:

int shm_queue_pull_end(QcShmQue* shmQue, int idx, QcErr *err)
{
    int index;

    qc_sem_wait(shmQue->sem_lst, -1);
	index = qc_staticlist_add_tail(&shmQue->p_shmQue->lst_free, idx);
	qc_assert(index>=0);
    qc_sem_post(shmQue->sem_lst);

    return 0;
}